

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O2

void __thiscall kj::std::anon_unknown_0::TestCase75::run(TestCase75 *this)

{
  int iVar1;
  StdInputStream in;
  StdOutputStream out;
  char buf [9];
  Fault f;
  stringstream ss;
  ostream local_2e8 [376];
  Maybe<kj::Exception> e;
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  in.super_InputStream._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_001c80e0;
  out.stream_ = local_2e8;
  out.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__ArrayOutputStream_001c8128;
  in.stream_ = (istream *)&ss;
  ::std::ostream::write((char *)out.stream_,0x189806);
  f.exception = (Exception *)&PTR_run_001c80b0;
  _::runCatchingExceptions(&e,(Runnable *)&f);
  buf[6] = '\0';
  if (e.ptr.isSet != false) {
    iVar1 = bcmp("foobar",&buf,7);
    if ((iVar1 != 0) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[9]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/std/iostream-test.c++"
                 ,0x62,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
                 (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
                 (char (*) [7])"foobar",&buf);
    }
    _::NullableValue<kj::Exception>::~NullableValue(&e.ptr);
    ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&out);
    BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&in);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return;
  }
  _::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/std/iostream-test.c++"
             ,0x5f,FAILED,"!(e == nullptr)","");
  _::Debug::Fault::fatal(&f);
}

Assistant:

TEST(StdIoStream, ReadToEndOfFile) {
  // Check that read throws an exception when eof is reached before specified
  // bytes.

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  const void* bytes = "foobar";

  out.write(bytes, 6);

  char buf[9];

  Maybe<Exception> e = kj::runCatchingExceptions([&]() {
    in.read(buf, 8, 8);
  });
  buf[6] = '\0';

  ASSERT_FALSE(e == nullptr);

  // Ensure that the value is still read up to the EOF.
  EXPECT_STREQ("foobar", buf);
}